

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

tnt_iter * tnt_iter_array(tnt_iter *i,char *data,size_t size)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  tnt_iter *ptVar4;
  uint32_t uVar5;
  char *pcVar6;
  char *local_28;
  char *tmp_data;
  
  local_28 = data;
  iVar3 = mp_check(&local_28,data + size);
  if ((((iVar3 == 0) && (size != 0 && data != (char *)0x0)) &&
      (mp_type_hint[(byte)*data] == MP_ARRAY)) &&
     (ptVar4 = tnt_iter_init(i), ptVar4 != (tnt_iter *)0x0)) {
    ptVar4->type = TNT_ITER_ARRAY;
    ptVar4->next = tnt_iter_array_next;
    ptVar4->rewind = tnt_iter_array_rewind;
    ptVar4->free = (_func_void_tnt_iter_ptr *)0x0;
    (ptVar4->data).array.data = data;
    bVar1 = *data;
    (ptVar4->data).array.first_elem = data + 1;
    if ((bVar1 & 0x40) == 0) {
      uVar5 = bVar1 & 0xf;
    }
    else {
      if ((bVar1 & 1) == 0) {
        pcVar6 = data + 3;
        uVar5 = (uint32_t)(ushort)(*(ushort *)(data + 1) << 8 | *(ushort *)(data + 1) >> 8);
      }
      else {
        uVar2 = *(uint *)(data + 1);
        uVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        pcVar6 = data + 5;
      }
      (ptVar4->data).array.first_elem = pcVar6;
    }
    (ptVar4->data).array.elem_count = uVar5;
    (ptVar4->data).array.cur_index = -1;
    return ptVar4;
  }
  return (tnt_iter *)0x0;
}

Assistant:

struct tnt_iter *
tnt_iter_array(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_ARRAY)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_ARRAY;
	i->next = tnt_iter_array_next;
	i->rewind = tnt_iter_array_rewind;
	i->free = NULL;
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->data = data;
	itr->first_elem = data;
	itr->elem_count = mp_decode_array(&itr->first_elem);
	itr->cur_index = -1;
	return i;
}